

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_xml.c
# Opt level: O0

LY_ERR lydxml_opaq_r(lyxml_ctx *xmlctx,lyd_node *parent)

{
  char cVar1;
  char *name_00;
  size_t name_len_00;
  char *prefix_00;
  size_t prefix_len_00;
  lyd_node *value_00;
  lyd_node *len;
  ly_ctx *ctx;
  lyd_attr *module_key;
  lyd_node_opaq *plVar2;
  size_t module_key_len;
  char *local_c8;
  LY_ERR ret___1;
  LY_ERR ret__;
  ly_bool dynamic;
  ly_bool ws_only;
  size_t value_len;
  size_t prefix_len;
  size_t name_len;
  char *value;
  char *prefix;
  char *name;
  lyd_node_opaq *opaq;
  lyd_node *node;
  lyd_attr *attr;
  lyxml_ns *ns;
  lyd_node *plStack_20;
  LY_ERR rc;
  lyd_node *parent_local;
  lyxml_ctx *xmlctx_local;
  
  ns._4_4_ = 0;
  node = (lyd_node *)0x0;
  opaq = (lyd_node_opaq *)0x0;
  plStack_20 = parent;
  parent_local = (lyd_node *)xmlctx;
  if (xmlctx->status != LYXML_ELEMENT) {
    __assert_fail("xmlctx->status == LYXML_ELEMENT",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                  ,0x586,"LY_ERR lydxml_opaq_r(struct lyxml_ctx *, struct lyd_node *)");
  }
  name_00 = (xmlctx->field_5).name;
  name_len_00 = (xmlctx->field_6).name_len;
  prefix_00 = (xmlctx->field_3).prefix;
  prefix_len_00 = (xmlctx->field_4).prefix_len;
  attr = (lyd_attr *)lyxml_ns_get(&xmlctx->ns,prefix_00,prefix_len_00);
  if (attr == (lyd_attr *)0x0) {
    lydxml_log_namespace_err((lyxml_ctx *)parent_local,prefix_00,prefix_len_00,(char *)0x0,0);
    xmlctx_local._4_4_ = LY_EVALID;
  }
  else {
    xmlctx_local._4_4_ = lyxml_ctx_next((lyxml_ctx *)parent_local);
    if ((xmlctx_local._4_4_ == LY_SUCCESS) &&
       ((*(int *)&parent_local->parent != 3 ||
        (xmlctx_local._4_4_ = lydxml_attrs((lyxml_ctx *)parent_local,(lyd_attr **)&node),
        xmlctx_local._4_4_ == LY_SUCCESS)))) {
      if (*(int *)&parent_local->parent != 2) {
        __assert_fail("xmlctx->status == LYXML_ELEM_CONTENT",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_xml.c"
                      ,0x59a,"LY_ERR lydxml_opaq_r(struct lyxml_ctx *, struct lyd_node *)");
      }
      value_00 = parent_local->next;
      len = parent_local->prev;
      cVar1 = *(char *)&parent_local->meta;
      ret___1._2_1_ = *(undefined1 *)&parent_local->priv;
      if (ret___1._2_1_ != LY_SUCCESS >> 0x10) {
        *(undefined1 *)&parent_local->priv = 0;
      }
      ctx = *(ly_ctx **)parent_local;
      module_key = attr->next;
      module_key_len = strlen((char *)attr->next);
      ns._4_4_ = lyd_create_opaq(ctx,name_00,name_len_00,prefix_00,prefix_len_00,(char *)module_key,
                                 module_key_len,(char *)0x0,0,(ly_bool *)0x0,LY_VALUE_XML,
                                 (void *)0x0,0,(lyd_node **)&opaq);
      if (ns._4_4_ == LY_SUCCESS) {
        opaq->attr = (lyd_attr *)node;
        node = (lyd_node *)0x0;
        ns._4_4_ = lyxml_ctx_next((lyxml_ctx *)parent_local);
        while (ns._4_4_ == LY_SUCCESS) {
          if (((lyxml_ctx *)parent_local)->status != LYXML_ELEMENT) {
            lyd_insert_node(plStack_20,(lyd_node **)0x0,(lyd_node *)opaq,1);
            plVar2 = opaq;
            if (opaq->child == (lyd_node *)0x0) {
              if (len != (lyd_node *)0x0) {
                lydict_remove(*(ly_ctx **)parent_local,opaq->value);
                if (ret___1._2_1_ == LY_SUCCESS >> 0x10) {
                  ns._4_4_ = lydict_insert(*(ly_ctx **)parent_local,(char *)value_00,(size_t)len,
                                           &plVar2->value);
                }
                else {
                  ns._4_4_ = lydict_insert_zc(*(ly_ctx **)parent_local,(char *)value_00,
                                              &plVar2->value);
                  if (ns._4_4_ == LY_SUCCESS) {
                    ret___1._2_1_ = LY_SUCCESS >> 0x10;
                  }
                }
              }
            }
            else if (cVar1 == '\0') {
              if ((opaq->field_0).node.schema == (lysc_node *)0x0) {
                local_c8 = (opaq->name).name;
              }
              else {
                local_c8 = ((opaq->field_0).node.schema)->name;
              }
              ly_vlog(*(ly_ctx **)parent_local,(char *)0x0,LYVE_SYNTAX_XML,
                      "Mixed XML content node \"%s\" found, not supported.",local_c8);
              ns._4_4_ = LY_EVALID;
            }
            break;
          }
          ns._4_4_ = lydxml_opaq_r((lyxml_ctx *)parent_local,(lyd_node *)opaq);
        }
      }
      lyd_free_attr_siblings(*(ly_ctx **)parent_local,(lyd_attr *)node);
      if (ret___1._2_1_ != LY_SUCCESS >> 0x10) {
        free(value_00);
      }
      if (ns._4_4_ != LY_SUCCESS) {
        lyd_free_tree((lyd_node *)opaq);
      }
      xmlctx_local._4_4_ = ns._4_4_;
    }
  }
  return xmlctx_local._4_4_;
}

Assistant:

static LY_ERR
lydxml_opaq_r(struct lyxml_ctx *xmlctx, struct lyd_node *parent)
{
    LY_ERR rc = LY_SUCCESS;
    const struct lyxml_ns *ns;
    struct lyd_attr *attr = NULL;
    struct lyd_node *node = NULL;
    struct lyd_node_opaq *opaq;
    const char *name, *prefix, *value = NULL;
    size_t name_len, prefix_len, value_len;
    ly_bool ws_only, dynamic = 0;

    assert(xmlctx->status == LYXML_ELEMENT);

    name = xmlctx->name;
    name_len = xmlctx->name_len;
    prefix = xmlctx->prefix;
    prefix_len = xmlctx->prefix_len;
    ns = lyxml_ns_get(&xmlctx->ns, prefix, prefix_len);
    if (!ns) {
        lydxml_log_namespace_err(xmlctx, prefix, prefix_len, NULL, 0);
        return LY_EVALID;
    }

    LY_CHECK_RET(lyxml_ctx_next(xmlctx));

    /* create attributes */
    if (xmlctx->status == LYXML_ATTRIBUTE) {
        LY_CHECK_RET(lydxml_attrs(xmlctx, &attr));
    }

    /* remember the value */
    assert(xmlctx->status == LYXML_ELEM_CONTENT);
    value = xmlctx->value;
    value_len = xmlctx->value_len;
    ws_only = xmlctx->ws_only;
    dynamic = xmlctx->dynamic;
    if (dynamic) {
        xmlctx->dynamic = 0;
    }

    /* create the node without value */
    rc = lyd_create_opaq(xmlctx->ctx, name, name_len, prefix, prefix_len, ns->uri, strlen(ns->uri), NULL, 0, NULL,
            LY_VALUE_XML, NULL, 0, &node);
    LY_CHECK_GOTO(rc, cleanup);

    /* assign atributes */
    ((struct lyd_node_opaq *)node)->attr = attr;
    attr = NULL;

    /* parser next element */
    LY_CHECK_GOTO(rc = lyxml_ctx_next(xmlctx), cleanup);

    /* parse all the descendants */
    while (xmlctx->status == LYXML_ELEMENT) {
        rc = lydxml_opaq_r(xmlctx, node);
        LY_CHECK_GOTO(rc, cleanup);
    }

    /* insert */
    lyd_insert_node(parent, NULL, node, LYD_INSERT_NODE_LAST);

    /* update the value */
    opaq = (struct lyd_node_opaq *)node;
    if (opaq->child) {
        if (!ws_only) {
            LOGVAL(xmlctx->ctx, LYVE_SYNTAX_XML, "Mixed XML content node \"%s\" found, not supported.", LYD_NAME(node));
            rc = LY_EVALID;
            goto cleanup;
        }
    } else if (value_len) {
        lydict_remove(xmlctx->ctx, opaq->value);
        if (dynamic) {
            LY_CHECK_GOTO(rc = lydict_insert_zc(xmlctx->ctx, (char *)value, &opaq->value), cleanup);
            dynamic = 0;
        } else {
            LY_CHECK_GOTO(rc = lydict_insert(xmlctx->ctx, value, value_len, &opaq->value), cleanup);
        }
    }

cleanup:
    lyd_free_attr_siblings(xmlctx->ctx, attr);
    if (dynamic) {
        free((char *)value);
    }
    if (rc) {
        lyd_free_tree(node);
    }
    return rc;
}